

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinflate.c
# Opt level: O1

int tinf_uncompress(void *dest,uint *destLen,void *source,uint sourceLen)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  tinf_data local_678;
  undefined8 local_178;
  undefined7 uStack_170;
  undefined4 uStack_169;
  char local_78;
  
  local_678.source_end = (uchar *)((ulong)sourceLen + (long)source);
  local_678.tag = 0;
  local_678.bitcount = 0;
  local_678.overflow = 0;
  local_678.dest_end = (uchar *)((ulong)*destLen + (long)dest);
  local_678.source = (uchar *)source;
  local_678.dest_start = (uchar *)dest;
  local_678.dest = (uchar *)dest;
  do {
    uVar3 = tinf_getbits(&local_678,1);
    uVar4 = tinf_getbits(&local_678,2);
    if (uVar4 == 2) {
      uVar4 = tinf_getbits(&local_678,5);
      uVar4 = uVar4 + 0x101;
      uVar5 = tinf_getbits(&local_678,5);
      uVar5 = uVar5 + 1;
      uVar6 = tinf_getbits(&local_678,4);
      iVar11 = -3;
      iVar9 = iVar11;
      if (uVar5 < 0x1f && uVar4 < 0x11f) {
        local_178 = 0;
        uStack_170 = 0;
        uStack_169 = 0;
        if (uVar6 + 4 != 0) {
          uVar12 = 0;
          do {
            uVar7 = tinf_getbits(&local_678,3);
            *(char *)((long)&local_178 + (ulong)(byte)(&tinf_decode_trees_clcidx)[uVar12]) =
                 (char)uVar7;
            uVar12 = uVar12 + 1;
          } while (uVar6 + 4 != uVar12);
        }
        iVar9 = tinf_build_tree(&local_678.ltree,(uchar *)&local_178,0x13);
        if ((iVar9 == 0) && (iVar9 = iVar11, local_678.ltree.max_sym != -1)) {
          uVar6 = 0;
          do {
            if (uVar4 + uVar5 <= uVar6) {
              if ((local_78 != '\0') &&
                 (iVar9 = tinf_build_tree(&local_678.ltree,(uchar *)&local_178,uVar4), iVar9 == 0))
              {
                iVar9 = tinf_build_tree(&local_678.dtree,(uchar *)((long)&local_178 + (ulong)uVar4),
                                        uVar5);
              }
              break;
            }
            uVar7 = tinf_decode_symbol(&local_678,&local_678.ltree);
            if (local_678.ltree.max_sym < (int)uVar7) {
LAB_001019e4:
              bVar2 = false;
            }
            else {
              if ((short)uVar7 == 0x12) {
                uVar8 = tinf_getbits(&local_678,7);
                uVar8 = uVar8 + 0xb;
LAB_001019d5:
                uVar7 = 0;
              }
              else {
                if ((uVar7 & 0xffff) == 0x11) {
                  uVar8 = tinf_getbits(&local_678,3);
                  uVar8 = uVar8 + 3;
                  goto LAB_001019d5;
                }
                if ((uVar7 & 0xffff) == 0x10) {
                  if (uVar6 == 0) {
                    uVar6 = 0;
                    goto LAB_001019e4;
                  }
                  uVar7 = (uint)*(byte *)((long)&local_178 + (ulong)(uVar6 - 1));
                  uVar8 = tinf_getbits(&local_678,2);
                  uVar8 = uVar8 + 3;
                }
                else {
                  uVar8 = 1;
                }
              }
              if ((uVar4 + uVar5) - uVar6 < uVar8) goto LAB_001019e4;
              bVar2 = true;
              for (; uVar8 != 0; uVar8 = uVar8 - 1) {
                uVar12 = (ulong)uVar6;
                uVar6 = uVar6 + 1;
                *(char *)((long)&local_178 + uVar12) = (char)uVar7;
              }
            }
          } while (bVar2);
        }
      }
      if (iVar9 == 0) goto LAB_00101a7e;
    }
    else if (uVar4 == 1) {
      local_678.ltree.counts[10] = 0;
      local_678.ltree.counts[0xb] = 0;
      local_678.ltree.counts[0xc] = 0;
      local_678.ltree.counts[0xd] = 0;
      local_678.ltree.counts[0xe] = 0;
      local_678.ltree.counts[0xf] = 0;
      local_678.ltree.counts[0] = 0;
      local_678.ltree.counts[1] = 0;
      local_678.ltree.counts[2] = 0;
      local_678.ltree.counts[3] = 0;
      local_678.ltree.counts[4] = 0;
      local_678.ltree.counts[5] = 0;
      local_678.ltree.counts[6] = 0;
      local_678.ltree.counts[7] = 0x18;
      local_678.ltree.counts[8] = 0x98;
      local_678.ltree.counts[9] = 0x70;
      lVar10 = 0x2c;
      do {
        local_678.ltree.counts[lVar10 + -0x1c] = (short)lVar10 + 0xd4;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x44);
      lVar10 = 0;
      do {
        local_678.ltree.symbols[lVar10 + 0x18] = (unsigned_short)lVar10;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x90);
      lVar10 = 0xd4;
      do {
        local_678.ltree.counts[lVar10 + -0x1c] = (short)lVar10 + 0x44;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0xdc);
      lVar10 = 0xdc;
      do {
        local_678.ltree.counts[lVar10 + -0x1c] = (short)lVar10 - 0x4c;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x14c);
      local_678.ltree.max_sym = 0x11d;
      local_678.dtree.counts[8] = 0;
      local_678.dtree.counts[9] = 0;
      local_678.dtree.counts[10] = 0;
      local_678.dtree.counts[0xb] = 0;
      local_678.dtree.counts[0xc] = 0;
      local_678.dtree.counts[0xd] = 0;
      local_678.dtree.counts[0xe] = 0;
      local_678.dtree.counts[0xf] = 0;
      local_678.dtree.counts[0] = 0;
      local_678.dtree.counts[1] = 0;
      local_678.dtree.counts[2] = 0;
      local_678.dtree.counts[3] = 0;
      local_678.dtree.counts[4] = 0;
      local_678.dtree.counts[5] = 0x20;
      local_678.dtree.counts[6] = 0;
      local_678.dtree.counts[7] = 0;
      lVar10 = 0;
      do {
        local_678.dtree.symbols[lVar10] = (unsigned_short)lVar10;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x20);
      local_678.dtree.max_sym = 0x1d;
LAB_00101a7e:
      iVar9 = tinf_inflate_block_data(&local_678,&local_678.ltree,&local_678.dtree);
    }
    else {
      iVar9 = -3;
      if ((uVar4 == 0) && (3 < (long)local_678.source_end - (long)local_678.source)) {
        uVar1 = *(ushort *)local_678.source;
        uVar4 = (uint)uVar1;
        if ((*(ushort *)((long)local_678.source + 2) ^ uVar1) == 0xffff) {
          local_678.source = (uchar *)((long)local_678.source + 4);
          if (((long)(ulong)uVar1 <= (long)local_678.source_end - (long)local_678.source) &&
             (iVar9 = -5, (long)(ulong)uVar1 <= (long)local_678.dest_end - (long)local_678.dest)) {
            if (uVar1 != 0) {
              do {
                uVar1 = *(ushort *)local_678.source;
                local_678.source = (uchar *)((long)local_678.source + 1);
                *local_678.dest = (uchar)uVar1;
                local_678.dest = local_678.dest + 1;
                uVar4 = uVar4 - 1;
              } while (uVar4 != 0);
            }
            local_678.tag = 0;
            local_678.bitcount = 0;
            iVar9 = 0;
          }
        }
      }
    }
    if (iVar9 != 0) {
      return iVar9;
    }
    if (uVar3 != 0) {
      iVar9 = -3;
      if (local_678.overflow == 0) {
        *destLen = (int)local_678.dest - (int)local_678.dest_start;
        iVar9 = 0;
      }
      return iVar9;
    }
  } while( true );
}

Assistant:

int tinf_uncompress(void *dest, unsigned int *destLen,
                    const void *source, unsigned int sourceLen)
{
	struct tinf_data d;
	int bfinal;

	/* Initialise data */
	d.source = (const unsigned char *) source;
	d.source_end = d.source + sourceLen;
	d.tag = 0;
	d.bitcount = 0;
	d.overflow = 0;

	d.dest = (unsigned char *) dest;
	d.dest_start = d.dest;
	d.dest_end = d.dest + *destLen;

	do {
		unsigned int btype;
		int res;

		/* Read final block flag */
		bfinal = tinf_getbits(&d, 1);

		/* Read block type (2 bits) */
		btype = tinf_getbits(&d, 2);

		/* Decompress block */
		switch (btype) {
		case 0:
			/* Decompress uncompressed block */
			res = tinf_inflate_uncompressed_block(&d);
			break;
		case 1:
			/* Decompress block with fixed Huffman trees */
			res = tinf_inflate_fixed_block(&d);
			break;
		case 2:
			/* Decompress block with dynamic Huffman trees */
			res = tinf_inflate_dynamic_block(&d);
			break;
		default:
			res = TINF_DATA_ERROR;
			break;
		}

		if (res != TINF_OK) {
			return res;
		}
	} while (!bfinal);

	/* Check for overflow in bit reader */
	if (d.overflow) {
		return TINF_DATA_ERROR;
	}

	*destLen = d.dest - d.dest_start;

	return TINF_OK;
}